

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerException.cpp
# Opt level: O2

string * ninx::lexer::exception::LexerException::make_message
                   (string *__return_storage_ptr__,int line,string *origin,string *message)

{
  ostream *poVar1;
  stringstream s;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"LexerError at line: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1a0,"\tfrom origin: ");
  std::operator<<(poVar1,(string *)origin);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
ninx::lexer::exception::LexerException::make_message(int line, const std::string &origin, const std::string &message) {
    std::stringstream s;
    s << "LexerError at line: " << line << ", " << message << std::endl;
    s << "\tfrom origin: " << origin;
    return s.str();
}